

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O2

JavascriptBigInt *
Js::JavascriptBigInt::CreateZeroWithLength(digit_t length,ScriptContext *scriptContext)

{
  Recycler *pRVar1;
  JavascriptBigInt *this;
  unsigned_long *ptr;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  local_58 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_80f2896;
  data.filename._0_4_ = 0x15;
  pRVar1 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  this = (JavascriptBigInt *)new<Memory::Recycler>(0x30,pRVar1,0x37a1d4);
  JavascriptBigInt(this,(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                        bigintTypeStatic).ptr);
  this->m_length = length;
  this->m_isNegative = false;
  this->m_maxLength = length;
  local_58 = (undefined1  [8])&unsigned_long::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_80f2896;
  data.filename._0_4_ = 0x19;
  data.plusSize = length;
  pRVar1 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  ptr = Memory::AllocateArray<Memory::Recycler,unsigned_long,false>
                  ((Memory *)pRVar1,(Recycler *)Memory::Recycler::AllocLeafZero,0,this->m_length);
  Memory::WriteBarrierPtr<unsigned_long>::WriteBarrierSet(&this->m_digits,ptr);
  return this;
}

Assistant:

JavascriptBigInt * JavascriptBigInt::CreateZeroWithLength(digit_t length, ScriptContext * scriptContext)
    {
        JavascriptBigInt * bigintNew = RecyclerNew(scriptContext->GetRecycler(), JavascriptBigInt, scriptContext->GetLibrary()->GetBigIntTypeStatic());
        bigintNew->m_length = length;
        bigintNew->m_isNegative = false;
        bigintNew->m_maxLength = length;
        bigintNew->m_digits = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(), digit_t, bigintNew->m_length);
        return bigintNew;
    }